

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void pnga_fill_patch(Integer g_a,Integer *lo,Integer *hi,void *val)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  logical lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  char *data_ptr;
  Integer loA [7];
  Integer type;
  Integer ndim;
  Integer hiA [7];
  Integer bunit [7];
  Integer ld [7];
  Integer loS [7];
  Integer dims [7];
  _iterator_hdl hdl;
  char *local_550;
  undefined8 local_548;
  long lStack_540;
  undefined1 local_538 [40];
  undefined8 uStack_510;
  long local_508 [8];
  long local_4c8;
  long local_4c0 [9];
  Integer *local_478;
  Integer *local_470;
  long local_468 [8];
  long local_428 [8];
  long local_3e8 [7];
  long alStack_3b0 [9];
  Integer local_368 [7];
  _iterator_hdl local_330;
  
  local_478 = lo;
  local_470 = hi;
  pnga_nodeid();
  bVar15 = _ga_sync_begin != 0;
  uStack_510._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar15) {
    pnga_sync();
  }
  pnga_inquire(g_a,&local_4c8,local_4c0,local_368);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&local_330);
  iVar3 = pnga_local_iterator_next(&local_330,local_508,local_4c0 + 1,&local_550,local_3e8);
  lVar10 = local_4c0[0];
  do {
    if (iVar3 == 0) {
      if (uStack_510._4_4_ != 0) {
        pnga_sync();
      }
      return;
    }
    local_4c0[0] = lVar10;
    if (0 < lVar10) {
      memcpy(alStack_3b0 + 1,local_508,lVar10 * 8);
    }
    lVar4 = pnga_patch_intersect(local_478,local_470,local_508,local_4c0 + 1,lVar10);
    if (lVar4 != 0) {
      if (0 < lVar10) {
        lVar5 = 0;
LAB_0011eeab:
        if (local_508[lVar5] <= alStack_3b0[lVar5 + 1]) break;
        if (lVar10 == 1) {
          lVar5 = 1;
          lVar13 = 0;
        }
        else {
          lVar5 = 1;
          lVar6 = 0;
          lVar13 = 0;
          do {
            lVar13 = lVar13 + (local_508[lVar6] - alStack_3b0[lVar6 + 1]) * lVar5;
            lVar5 = lVar5 * local_3e8[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar10 + -1 != lVar6);
        }
        if (local_4c8 - 0x3e9U < 0x10) {
          lVar13 = ((&uStack_510)[lVar10] - alStack_3b0[lVar10]) * lVar5 + lVar13;
          switch(local_4c8) {
          case 0x3e9:
          case 0x3eb:
            lVar13 = lVar13 * 4;
            break;
          case 0x3ea:
          case 0x3ec:
          case 0x3ee:
          case 0x3f8:
            lVar13 = lVar13 * 8;
            break;
          default:
            goto switchD_0011ef3f_caseD_3ed;
          case 0x3ef:
            lVar13 = lVar13 * 0x10;
          }
          local_550 = local_550 + lVar13;
        }
        else {
switchD_0011ef3f_caseD_3ed:
          pnga_error(" wrong data type ",local_4c8);
        }
      }
LAB_0011ef64:
      lVar5 = local_4c0[0];
      lVar10 = local_4c8;
      pcVar2 = local_550;
      lVar13 = 1;
      if (1 < local_4c0[0]) {
        lVar6 = 1;
        do {
          lVar13 = lVar13 * ((local_4c0[lVar6 + 1] - local_508[lVar6]) + 1);
          lVar6 = lVar6 + 1;
        } while (local_4c0[0] != lVar6);
      }
      local_548 = 0;
      lStack_540 = 0;
      local_428[0] = 1;
      local_428[1] = 1;
      local_468[0] = local_3e8[0];
      local_468[1] = local_3e8[0] * local_3e8[1];
      if (2 < local_4c0[0]) {
        memset(local_538,0,local_4c0[0] * 8 - 0x10);
        lVar7 = 2;
        lVar6 = local_468[1];
        lVar8 = local_428[1];
        do {
          lVar8 = lVar8 * ((local_4c0[lVar7] - (&uStack_510)[lVar7]) + 1);
          lVar6 = lVar6 * local_3e8[lVar7];
          local_428[lVar7] = lVar8;
          local_468[lVar7] = lVar6;
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
      lVar8 = local_4c0[1];
      lVar6 = local_508[0];
      switch(lVar10) {
      case 0x3e9:
        if (0 < lVar13) {
          lVar10 = local_4c0[1] - local_508[0];
          lVar7 = 0;
          do {
            if (lVar5 < 2) {
              lVar12 = 0;
            }
            else {
              lVar14 = 0;
              lVar12 = 0;
              do {
                lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                if ((lVar7 + 1) % local_428[lVar14 + 1] == 0) {
                  *(long *)(local_538 + lVar14 * 8 + -8) = lVar9 + 1;
                }
                lVar12 = lVar12 + lVar9 * local_468[lVar14];
                lVar9 = 0;
                if (*(long *)(local_538 + lVar14 * 8 + -8) <=
                    local_4c0[lVar14 + 2] - local_508[lVar14 + 1]) {
                  lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                }
                *(long *)(local_538 + lVar14 * 8 + -8) = lVar9;
                lVar14 = lVar14 + 1;
              } while (lVar5 + -1 != lVar14);
            }
            if (lVar6 <= lVar8) {
              lVar14 = 0;
              do {
                *(undefined4 *)(pcVar2 + lVar14 * 4 + lVar12 * 4) = *val;
                lVar14 = lVar14 + 1;
              } while (lVar10 + 1 != lVar14);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar13);
        }
        break;
      case 0x3ea:
        if (0 < lVar13) {
          lVar10 = 0;
          do {
            if (lVar5 < 2) {
              lVar6 = 0;
            }
            else {
              lVar8 = 0;
              lVar6 = 0;
              do {
                lVar7 = *(long *)(local_538 + lVar8 * 8 + -8);
                if ((lVar10 + 1) % local_428[lVar8 + 1] == 0) {
                  *(long *)(local_538 + lVar8 * 8 + -8) = lVar7 + 1;
                }
                lVar6 = lVar6 + lVar7 * local_468[lVar8];
                lVar7 = 0;
                if (*(long *)(local_538 + lVar8 * 8 + -8) <=
                    local_4c0[lVar8 + 2] - local_508[lVar8 + 1]) {
                  lVar7 = *(long *)(local_538 + lVar8 * 8 + -8);
                }
                *(long *)(local_538 + lVar8 * 8 + -8) = lVar7;
                lVar8 = lVar8 + 1;
              } while (lVar5 + -1 != lVar8);
            }
            if (local_508[0] <= local_4c0[1]) {
              lVar8 = -1;
              do {
                *(undefined8 *)(pcVar2 + lVar8 * 8 + lVar6 * 8 + 8) = *val;
                lVar8 = lVar8 + 1;
              } while (lVar8 < local_4c0[1] - local_508[0]);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != lVar13);
        }
        break;
      case 0x3eb:
        if (0 < lVar13) {
          lVar10 = local_4c0[1] - local_508[0];
          lVar7 = 0;
          do {
            if (lVar5 < 2) {
              lVar12 = 0;
            }
            else {
              lVar14 = 0;
              lVar12 = 0;
              do {
                lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                if ((lVar7 + 1) % local_428[lVar14 + 1] == 0) {
                  *(long *)(local_538 + lVar14 * 8 + -8) = lVar9 + 1;
                }
                lVar12 = lVar12 + lVar9 * local_468[lVar14];
                lVar9 = 0;
                if (*(long *)(local_538 + lVar14 * 8 + -8) <=
                    local_4c0[lVar14 + 2] - local_508[lVar14 + 1]) {
                  lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                }
                *(long *)(local_538 + lVar14 * 8 + -8) = lVar9;
                lVar14 = lVar14 + 1;
              } while (lVar5 + -1 != lVar14);
            }
            if (lVar6 <= lVar8) {
              lVar14 = 0;
              do {
                *(undefined4 *)(pcVar2 + lVar14 * 4 + lVar12 * 4) = *val;
                lVar14 = lVar14 + 1;
              } while (lVar10 + 1 != lVar14);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar13);
        }
        break;
      case 0x3ec:
        if (0 < lVar13) {
          lVar10 = local_4c0[1] - local_508[0];
          lVar7 = 0;
          do {
            if (lVar5 < 2) {
              lVar12 = 0;
            }
            else {
              lVar14 = 0;
              lVar12 = 0;
              do {
                lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                if ((lVar7 + 1) % local_428[lVar14 + 1] == 0) {
                  *(long *)(local_538 + lVar14 * 8 + -8) = lVar9 + 1;
                }
                lVar12 = lVar12 + lVar9 * local_468[lVar14];
                lVar9 = 0;
                if (*(long *)(local_538 + lVar14 * 8 + -8) <=
                    local_4c0[lVar14 + 2] - local_508[lVar14 + 1]) {
                  lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                }
                *(long *)(local_538 + lVar14 * 8 + -8) = lVar9;
                lVar14 = lVar14 + 1;
              } while (lVar5 + -1 != lVar14);
            }
            if (lVar6 <= lVar8) {
              lVar14 = 0;
              do {
                *(undefined8 *)(pcVar2 + lVar14 * 8 + lVar12 * 8) = *val;
                lVar14 = lVar14 + 1;
              } while (lVar10 + 1 != lVar14);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar13);
        }
        break;
      default:
        pnga_error(" wrong data type ",lVar10);
        break;
      case 0x3ee:
        if (0 < lVar13) {
          lVar10 = local_4c0[1] - local_508[0];
          lVar7 = 0;
          do {
            if (lVar5 < 2) {
              lVar12 = 0;
            }
            else {
              lVar14 = 0;
              lVar12 = 0;
              do {
                lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                if ((lVar7 + 1) % local_428[lVar14 + 1] == 0) {
                  *(long *)(local_538 + lVar14 * 8 + -8) = lVar9 + 1;
                }
                lVar12 = lVar12 + lVar9 * local_468[lVar14];
                lVar9 = 0;
                if (*(long *)(local_538 + lVar14 * 8 + -8) <=
                    local_4c0[lVar14 + 2] - local_508[lVar14 + 1]) {
                  lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                }
                *(long *)(local_538 + lVar14 * 8 + -8) = lVar9;
                lVar14 = lVar14 + 1;
              } while (lVar5 + -1 != lVar14);
            }
            if (lVar6 <= lVar8) {
              lVar14 = 0;
              do {
                *(undefined8 *)(pcVar2 + lVar14 * 8 + lVar12 * 8) = *val;
                lVar14 = lVar14 + 1;
              } while (lVar10 + 1 != lVar14);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar13);
        }
        break;
      case 0x3ef:
        if (0 < lVar13) {
          lVar10 = local_4c0[1] - local_508[0];
          lVar7 = 0;
          do {
            if (lVar5 < 2) {
              lVar12 = 0;
            }
            else {
              lVar14 = 0;
              lVar12 = 0;
              do {
                lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                if ((lVar7 + 1) % local_428[lVar14 + 1] == 0) {
                  *(long *)(local_538 + lVar14 * 8 + -8) = lVar9 + 1;
                }
                lVar12 = lVar12 + lVar9 * local_468[lVar14];
                lVar9 = 0;
                if (*(long *)(local_538 + lVar14 * 8 + -8) <=
                    local_4c0[lVar14 + 2] - local_508[lVar14 + 1]) {
                  lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                }
                *(long *)(local_538 + lVar14 * 8 + -8) = lVar9;
                lVar14 = lVar14 + 1;
              } while (lVar5 + -1 != lVar14);
            }
            if (lVar6 <= lVar8) {
              pcVar11 = pcVar2 + lVar12 * 0x10;
              lVar12 = lVar10 + 1;
              do {
                uVar1 = *(undefined8 *)((long)val + 8);
                *(undefined8 *)pcVar11 = *val;
                *(undefined8 *)(pcVar11 + 8) = uVar1;
                pcVar11 = pcVar11 + 0x10;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar13);
        }
        break;
      case 0x3f8:
        if (0 < lVar13) {
          lVar10 = local_4c0[1] - local_508[0];
          lVar7 = 0;
          do {
            if (lVar5 < 2) {
              lVar12 = 0;
            }
            else {
              lVar14 = 0;
              lVar12 = 0;
              do {
                lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                if ((lVar7 + 1) % local_428[lVar14 + 1] == 0) {
                  *(long *)(local_538 + lVar14 * 8 + -8) = lVar9 + 1;
                }
                lVar12 = lVar12 + lVar9 * local_468[lVar14];
                lVar9 = 0;
                if (*(long *)(local_538 + lVar14 * 8 + -8) <=
                    local_4c0[lVar14 + 2] - local_508[lVar14 + 1]) {
                  lVar9 = *(long *)(local_538 + lVar14 * 8 + -8);
                }
                *(long *)(local_538 + lVar14 * 8 + -8) = lVar9;
                lVar14 = lVar14 + 1;
              } while (lVar5 + -1 != lVar14);
            }
            if (lVar6 <= lVar8) {
              lVar14 = 0;
              do {
                *(undefined8 *)(pcVar2 + lVar14 * 8 + lVar12 * 8) = *val;
                lVar14 = lVar14 + 1;
              } while (lVar10 + 1 != lVar14);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != lVar13);
        }
      }
    }
    iVar3 = pnga_local_iterator_next(&local_330,local_508,local_4c0 + 1,&local_550,local_3e8);
    lVar10 = local_4c0[0];
  } while( true );
  lVar5 = lVar5 + 1;
  if (lVar10 == lVar5) goto LAB_0011ef64;
  goto LAB_0011eeab;
}

Assistant:

void pnga_fill_patch(Integer g_a, Integer *lo, Integer *hi, void* val)
{
  Integer i;
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  char *data_ptr;
  Integer num_blocks, nproc;
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync(); 


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            data_ptr = (void*)((int*)data_ptr + offset);
            break;
          case C_DCPL:
            data_ptr = (void*)((double*)data_ptr + 2*offset);
            break;
          case C_SCPL:
            data_ptr = (void*)((float*)data_ptr + 2*offset);
            break;
          case C_DBL:
            data_ptr = (void*)((double*)data_ptr + offset);
            break;
          case C_FLOAT:
            data_ptr = (void*)((float*)data_ptr + offset);
            break;     
          case C_LONG:
            data_ptr = (void*)((long*)data_ptr + offset);
            break;                          
          case C_LONGLONG:
            data_ptr = (void*)((long long*)data_ptr + offset);
            break;                          
          default: pnga_error(" wrong data type ",type);
        }
      }

      /* set all values in patch to *val */
      snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);
    }
  }
#else
  if (num_blocks < 0) {
    /* get limits of VISIBLE patch */ 
    pnga_distribution(g_a, me, loA, hiA);

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* get data_ptr to corner of patch */
      /* ld are leading dimensions INCLUDING ghost cells */
      pnga_access_ptr(g_a, loA, hiA, &data_ptr, ld);

      /* set all values in patch to *val */
      snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA);
    }
  } else {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of patch */ 
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;     
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;                          
              case C_LONGLONG:
                data_ptr = (void*)((long long*)data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;     
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;                          
              case C_LONGLONG:
                data_ptr = (void*)((long long*)data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_set_patch_value(type, ndim, loA, hiA, ld, data_ptr, val);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}